

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=(string<unsigned_short> *this,char *c)

{
  undefined1 auVar1 [16];
  unsigned_short *puVar2;
  ulong uVar3;
  unsigned_short *puVar4;
  int local_3c;
  s32 l;
  unsigned_short *oldArray;
  char *p;
  s32 len;
  char *c_local;
  string<unsigned_short> *this_local;
  
  if (c == (char *)0x0) {
    if (this->array == (unsigned_short *)0x0) {
      puVar2 = (unsigned_short *)operator_new__(2);
      this->array = puVar2;
      this->allocated = 1;
      this->used = 1;
    }
    *this->array = 0;
  }
  else if ((unsigned_short *)c != this->array) {
    p._4_4_ = 0;
    for (oldArray = (unsigned_short *)c; (char)*oldArray != '\0';
        oldArray = (unsigned_short *)((long)oldArray + 1)) {
      p._4_4_ = p._4_4_ + 1;
    }
    puVar2 = this->array;
    this->used = p._4_4_ + 1;
    this->allocated = p._4_4_ + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->used;
    uVar3 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    puVar4 = (unsigned_short *)operator_new__(uVar3);
    this->array = puVar4;
    for (local_3c = 0; local_3c < p._4_4_ + 1; local_3c = local_3c + 1) {
      this->array[local_3c] = (short)c[local_3c];
    }
    if (puVar2 != (unsigned_short *)0x0) {
      operator_delete__(puVar2);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}